

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>_>::Divide
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>_> *this,
          TPZVec<TPZGeoEl_*> *SubElVec)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  TPZAutoPointer *this_00;
  ostream *this_01;
  TPZRefPattern *pTVar7;
  TPZGeoEl *pTVar8;
  TPZGeoEl **ppTVar9;
  long lVar10;
  int64_t iVar11;
  long *plVar12;
  undefined8 uVar13;
  TPZRefPattern *gel;
  TPZGeoEl *pTVar14;
  TPZVec<TPZGeoEl_*> *in_RSI;
  TPZGeoEl *in_RDI;
  TPZGeoElSide gs;
  TPZGeoElSide neighbour;
  TPZGeoElSide refneigh;
  TPZGeoElSide thisside;
  TPZGeoEl *refsubel;
  TPZGeoEl *subel;
  int64_t cornerid;
  TPZManVector<long,_30> cornerindexes;
  int subcorner;
  int nnodes;
  TPZManVector<long,_30> np;
  int64_t totalnodes;
  int matid;
  int sub;
  int k;
  int j;
  int64_t index;
  int NSubEl;
  int i;
  iterator it;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> compat;
  TPZAutoPointer<TPZRefPattern> uniform;
  MElementType typeel;
  MElementType in_stack_0000178c;
  TPZRefPatternDataBase *in_stack_00001790;
  undefined4 in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa6c;
  undefined4 in_stack_fffffffffffffa70;
  uint in_stack_fffffffffffffa74;
  TPZGeoEl *in_stack_fffffffffffffa78;
  TPZVec<long> *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  TPZRefPattern *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  TPZManVector<long,_30> *in_stack_fffffffffffffaa0;
  bool local_551;
  MElementType in_stack_fffffffffffffb14;
  TPZRefPatternDataBase *in_stack_fffffffffffffb18;
  TPZRefPattern *in_stack_fffffffffffffb68;
  undefined1 local_3e8 [120];
  TPZAutoPointer<TPZRefPattern> local_370;
  TPZGeoElSide local_368;
  TPZGeoElSide local_350;
  TPZAutoPointer<TPZRefPattern> local_338;
  TPZGeoEl *local_330;
  TPZAutoPointer<TPZRefPattern> local_328;
  undefined8 local_320;
  TPZAutoPointer<TPZRefPattern> local_318;
  int64_t local_310;
  TPZVec<long> local_308 [8];
  TPZAutoPointer<TPZRefPattern> local_1f8;
  int local_1ec;
  TPZAutoPointer<TPZRefPattern> local_1e8;
  TPZAutoPointer<TPZRefPattern> local_1e0;
  int local_1d4;
  undefined8 local_1d0;
  TPZVec<long> local_1c8;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
  *in_stack_fffffffffffffe68;
  TPZGeoEl *in_stack_fffffffffffffe70;
  TPZAutoPointer<TPZRefPattern> local_b8;
  long local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  uint local_9c;
  undefined1 local_98 [8];
  TPZAutoPointer<TPZRefPattern> local_90;
  int local_84;
  int local_80;
  uint local_7c;
  undefined1 local_78 [8];
  _Self local_70;
  _List_node_base *local_68;
  _Self local_60;
  _Self local_58 [4];
  TPZAutoPointer local_38 [24];
  TPZAutoPointer local_20 [12];
  int local_14;
  TPZVec<TPZGeoEl_*> *local_10;
  
  local_10 = in_RSI;
  bVar2 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&in_RDI[0x96].fMatId);
  if (!bVar2) {
    local_14 = (**(code **)(*(long *)in_RDI + 0xb8))();
    if (local_14 == 0) {
      return;
    }
    TPZRefPatternDataBase::GetUniformRefPattern(in_stack_fffffffffffffb18,in_stack_fffffffffffffb14)
    ;
    bVar2 = ::TPZAutoPointer::operator_cast_to_bool(local_20);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)
               CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      TPZRefPatternDataBase::InitializeUniformRefPattern(in_stack_00001790,in_stack_0000178c);
    }
    TPZRefPatternDataBase::GetUniformRefPattern(in_stack_fffffffffffffb18,in_stack_fffffffffffffb14)
    ;
    std::__cxx11::
    list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::list
              ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                *)0x16c3120);
    TPZRefPatternTools::GetCompatibleRefPatterns
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_58[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::begin
                   ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                     *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    while( true ) {
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::end
                     ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                       *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      bVar2 = std::operator!=(local_58,&local_60);
      if (!bVar2) break;
      this_00 = (TPZAutoPointer *)
                std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator*
                          ((_List_iterator<TPZAutoPointer<TPZRefPattern>_> *)0x16c318c);
      bVar2 = ::TPZAutoPointer::operator_cast_to_bool(this_00);
      bVar3 = ::TPZAutoPointer::operator_cast_to_bool(local_38);
      if (bVar2 == bVar3) break;
      local_68 = (_List_node_base *)
                 std::_List_iterator<TPZAutoPointer<TPZRefPattern>_>::operator++(local_58,0);
    }
    local_70._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::end
                   ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                     *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    bVar2 = std::operator!=(local_58,&local_70);
    if (bVar2) {
      TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                 (TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      (**(code **)(*(long *)in_RDI + 0x2a8))(in_RDI,local_78);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    }
    else {
      this_01 = std::operator<<((ostream *)&std::cerr,
                                "TPZGeoElRefPattern<TGeo>::Divide ERROR : Undefined Refinement Pattern!"
                               );
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      (*local_10->_vptr_TPZVec[3])(local_10,0);
    }
    local_7c = (uint)!bVar2;
    std::__cxx11::
    list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::~list
              ((list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                *)0x16c331f);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)
               CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    if (local_7c != 0) {
      return;
    }
  }
  (**(code **)(*(long *)in_RDI + 0x2b0))();
  pTVar7 = TPZAutoPointer<TPZRefPattern>::operator->(&local_90);
  iVar4 = TPZRefPattern::NSubElements(pTVar7);
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
            ((TPZAutoPointer<TPZRefPattern> *)
             CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  local_84 = iVar4;
  iVar4 = (**(code **)(*(long *)in_RDI + 0x1d0))();
  if (iVar4 == 0) {
    local_a8 = TPZGeoEl::MaterialId(in_RDI);
    (**(code **)(*(long *)in_RDI + 0x2b0))();
    TPZAutoPointer<TPZRefPattern>::operator->(&local_b8);
    iVar4 = TPZRefPattern::NNodes((TPZRefPattern *)0x16c34f0);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)
               CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    local_1d0 = 0;
    local_b0 = (long)iVar4;
    TPZManVector<long,_30>::TPZManVector
              (in_stack_fffffffffffffaa0,
               CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               (long *)in_stack_fffffffffffffa90);
    local_1d4 = (**(code **)(*(long *)in_RDI + 0x98))();
    for (local_9c = 0; (int)local_9c < local_1d4; local_9c = local_9c + 1) {
      lVar10 = (**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,local_9c);
      (**(code **)(*(long *)in_RDI + 0x2b0))(&local_1e0);
      TPZAutoPointer<TPZRefPattern>::operator->(&local_1e0);
      pTVar8 = TPZRefPattern::Element
                         ((TPZRefPattern *)
                          CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                          in_stack_fffffffffffffa6c);
      iVar11 = (**(code **)(*(long *)pTVar8 + 0xa8))(pTVar8,local_9c);
      plVar12 = TPZVec<long>::operator[](&local_1c8,iVar11);
      *plVar12 = lVar10;
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    }
    (**(code **)(*(long *)in_RDI + 0x2b0))(&local_1e8);
    pTVar7 = TPZAutoPointer<TPZRefPattern>::operator->(&local_1e8);
    TPZRefPattern::CreateNewNodes
              (in_stack_fffffffffffffa90,
               (TPZGeoEl *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)
               CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    for (local_80 = 0; local_80 < local_84; local_80 = local_80 + 1) {
      (**(code **)(*(long *)in_RDI + 0x2b0))(&local_1f8);
      in_stack_fffffffffffffb68 = TPZAutoPointer<TPZRefPattern>::operator->(&local_1f8);
      pTVar8 = TPZRefPattern::Element
                         ((TPZRefPattern *)
                          CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                          in_stack_fffffffffffffa6c);
      iVar4 = (**(code **)(*(long *)pTVar8 + 0x98))();
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      local_1ec = iVar4;
      TPZManVector<long,_30>::TPZManVector
                ((TPZManVector<long,_30> *)in_stack_fffffffffffffa90,
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      for (local_9c = 0; (int)local_9c < local_1ec; local_9c = local_9c + 1) {
        (**(code **)(*(long *)in_RDI + 0x2b0))(&local_318);
        TPZAutoPointer<TPZRefPattern>::operator->(&local_318);
        pTVar8 = TPZRefPattern::Element
                           ((TPZRefPattern *)
                            CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                            in_stack_fffffffffffffa6c);
        iVar11 = (**(code **)(*(long *)pTVar8 + 0xa8))(pTVar8,local_9c);
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZRefPattern> *)
                   CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
        local_310 = iVar11;
        plVar12 = TPZVec<long>::operator[](&local_1c8,iVar11);
        lVar10 = *plVar12;
        plVar12 = TPZVec<long>::operator[](local_308,(long)(int)local_9c);
        *plVar12 = lVar10;
      }
      (**(code **)(*(long *)in_RDI + 0x2b0))(&local_328);
      TPZAutoPointer<TPZRefPattern>::operator->(&local_328);
      pTVar8 = TPZRefPattern::Element
                         ((TPZRefPattern *)
                          CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                          in_stack_fffffffffffffa6c);
      uVar5 = (**(code **)(*(long *)pTVar8 + 0xb8))();
      uVar13 = (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,uVar5,local_308,local_a8,local_98);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      local_320 = uVar13;
      (**(code **)(*(long *)in_RDI + 0x1b0))(in_RDI,local_80,uVar13);
      TPZManVector<long,_30>::~TPZManVector
                ((TPZManVector<long,_30> *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    }
    (*local_10->_vptr_TPZVec[3])(local_10,(long)local_84);
    for (local_a4 = 0; local_a4 < local_84; local_a4 = local_a4 + 1) {
      pTVar8 = (TPZGeoEl *)(**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_a4);
      ppTVar9 = TPZVec<TPZGeoEl_*>::operator[](local_10,(long)local_a4);
      *ppTVar9 = pTVar8;
      TPZVec<TPZGeoEl_*>::operator[](local_10,(long)local_a4);
      TPZGeoEl::SetFather((TPZGeoEl *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                          (TPZGeoEl *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68))
      ;
      ppTVar9 = TPZVec<TPZGeoEl_*>::operator[](local_10,(long)local_a4);
      (**(code **)(*(long *)*ppTVar9 + 0x1f0))(*ppTVar9,in_RDI->fIndex);
    }
    for (local_80 = 0; local_80 < local_84; local_80 = local_80 + 1) {
      (**(code **)(*(long *)in_RDI + 0x2b0))(&local_338);
      TPZAutoPointer<TPZRefPattern>::operator->(&local_338);
      pTVar8 = TPZRefPattern::Element
                         ((TPZRefPattern *)
                          CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                          in_stack_fffffffffffffa6c);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)
                 CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      local_330 = pTVar8;
      for (local_9c = 0; uVar1 = local_9c, iVar4 = (**(code **)(*(long *)local_330 + 0xf0))(),
          (int)uVar1 < iVar4; local_9c = local_9c + 1) {
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                   in_stack_fffffffffffffa74);
        (**(code **)(*(long *)local_330 + 0x188))(&local_368,local_330,local_9c);
        iVar4 = TPZGeoElSide::Exists(&local_368);
        if ((iVar4 == 0) || (iVar6 = TPZGeoElSide::operator!=(&local_368,&local_350), iVar6 == 0)) {
          in_stack_fffffffffffffa80 =
               (TPZVec<long> *)(**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_80);
          in_stack_fffffffffffffa74 = local_9c;
          in_stack_fffffffffffffa78 =
               (TPZGeoEl *)(**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_80);
          TPZGeoElSide::TPZGeoElSide
                    ((TPZGeoElSide *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                     in_stack_fffffffffffffa74);
          (*in_stack_fffffffffffffa80->_vptr_TPZVec[0x33])
                    (in_stack_fffffffffffffa80,(ulong)in_stack_fffffffffffffa74,local_3e8);
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16c4172);
        }
        else {
          for (local_a0 = 0; local_a0 < local_84 + 1; local_a0 = local_a0 + 1) {
            (**(code **)(*(long *)in_RDI + 0x2b0))(&local_370);
            gel = TPZAutoPointer<TPZRefPattern>::operator->(&local_370);
            pTVar8 = TPZRefPattern::Element
                               ((TPZRefPattern *)
                                CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                                in_stack_fffffffffffffa6c);
            pTVar14 = TPZGeoElSide::Element(&local_368);
            local_551 = pTVar8 == pTVar14 && local_a0 + -1 != local_80;
            TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                      ((TPZAutoPointer<TPZRefPattern> *)
                       CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
            if (local_551) {
              TPZGeoElSide::TPZGeoElSide
                        ((TPZGeoElSide *)
                         CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
              if (local_a0 == 0) {
                TPZGeoElSide::Side(&local_368);
                TPZGeoElSide::TPZGeoElSide
                          ((TPZGeoElSide *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                           in_stack_fffffffffffffa74);
                TPZGeoElSide::operator=
                          ((TPZGeoElSide *)
                           CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                           (TPZGeoElSide *)
                           CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
                TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16c3fd2);
              }
              else {
                (**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_a0 + -1);
                TPZGeoElSide::Side(&local_368);
                TPZGeoElSide::TPZGeoElSide
                          ((TPZGeoElSide *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                           in_stack_fffffffffffffa74);
                TPZGeoElSide::operator=
                          ((TPZGeoElSide *)
                           CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                           (TPZGeoElSide *)
                           CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
                TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16c3ee6);
              }
              (**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_80);
              TPZGeoElSide::TPZGeoElSide
                        ((TPZGeoElSide *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                         in_stack_fffffffffffffa74);
              iVar4 = TPZGeoElSide::NeighbourExists
                                ((TPZGeoElSide *)CONCAT44(iVar4,iVar6),(TPZGeoElSide *)gel);
              if (iVar4 == 0) {
                TPZGeoElSide::SetConnectivity
                          ((TPZGeoElSide *)pTVar7,(TPZGeoElSide *)in_stack_fffffffffffffb68);
              }
              local_7c = 0x19;
              TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16c4087);
              TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16c4094);
              break;
            }
          }
        }
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16c41a4);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16c41b1);
      }
    }
    (**(code **)(*(long *)in_RDI + 0x1b8))();
    TPZManVector<long,_30>::~TPZManVector
              ((TPZManVector<long,_30> *)
               CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  }
  else {
    (*local_10->_vptr_TPZVec[3])(local_10,(long)local_84);
    for (local_80 = 0; local_80 < local_84; local_80 = local_80 + 1) {
      pTVar8 = (TPZGeoEl *)(**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,local_80);
      ppTVar9 = TPZVec<TPZGeoEl_*>::operator[](local_10,(long)local_80);
      *ppTVar9 = pTVar8;
    }
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Divide(TPZVec<TPZGeoEl *> &SubElVec){
	if (!fRefPattern) {
		MElementType typeel = this->Type();
		if(typeel == EPoint)
			return;
		if(!gRefDBase.GetUniformRefPattern(typeel))
		{
			gRefDBase.InitializeUniformRefPattern(typeel);
		}
		TPZAutoPointer<TPZRefPattern> uniform = gRefDBase.GetUniformRefPattern(typeel);
		std::list<TPZAutoPointer<TPZRefPattern> > compat;
		TPZRefPatternTools::GetCompatibleRefPatterns(this,compat);
		std::list<TPZAutoPointer<TPZRefPattern> >::iterator it = compat.begin();
		while(it != compat.end()){
			if(*it == uniform) break;
			it++;
		}
		if(it != compat.end())
		{
			this->SetRefPattern(uniform);
		}
		else
		{
			PZError << "TPZGeoElRefPattern<TGeo>::Divide ERROR : Undefined Refinement Pattern!" << std::endl;
			SubElVec.Resize(0);
			return;
		}
	}
	int i;
	int NSubEl = this->GetRefPattern()->NSubElements();
	if(HasSubElement()) {
		SubElVec.Resize(NSubEl);
		for(i=0;i<NSubEl;i++) SubElVec[i] = SubElement(i);
#ifdef PZ_LOG
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
        if(loggerrefpattern.isWarnEnabled())
		{
			std::stringstream sout;
			sout << "Trying to divide element which has subelements " << this->Index() << std::endl;
			sout << "Subelement indices ";
			for(i=0; i<NSubEl; i++) sout << SubElVec[i]->Index() << " ";
			LOGPZ_WARN(loggerrefpattern,sout.str());
		}
#endif
		return;//If exist fSubEl return this sons
	}
	int64_t index;
	int j, k, sub, matid=this->MaterialId();
	
	int64_t totalnodes = this->GetRefPattern()->NNodes();
	TPZManVector<int64_t,30> np(totalnodes,0);
	int nnodes = this->NCornerNodes();
	
	for(j=0;j<nnodes;j++) {
		np[this->GetRefPattern()->Element(0)->NodeIndex(j)] = this->NodeIndex(j);
	}
	this->GetRefPattern()->CreateNewNodes (this, np);
	//std::cout << "NewNodeIndexes : " << np << std::endl;
	
	// creating new subelements
	for(i=0;i<NSubEl;i++) {
		int subcorner = this->GetRefPattern()->Element(i+1)->NCornerNodes();
		TPZManVector<int64_t,30> cornerindexes(subcorner);
		for(j=0;j<subcorner;j++) {
			int64_t cornerid = this->GetRefPattern()->Element(i+1)->NodeIndex(j);
			cornerindexes[j] = np[cornerid];
		}
		//std::cout << "Subel corner " << cornerindexes << std::endl;
		TPZGeoEl *subel = this->CreateGeoElement((MElementType)this->GetRefPattern()->Element(i+1)->Type(),cornerindexes,matid,index);
		SetSubElement(i,subel);
	}
	
	SubElVec.Resize(NSubEl);
	for(sub=0;sub<NSubEl;sub++) {
		SubElVec[sub] = SubElement(sub);
		SubElVec[sub]->SetFather(this);
		SubElVec[sub]->SetFatherIndex(this->fIndex);
	}

	for(i=0;i<NSubEl;i++) {
		//std::cout << "SubElement " << i << std::endl;
		TPZGeoEl *refsubel = this->GetRefPattern()->Element(i+1);
		for (j=0;j<refsubel->NSides();j++){
			//std::cout << "\t Side " << j << std::endl;
			TPZGeoElSide thisside (refsubel,j);
			TPZGeoElSide refneigh = refsubel->Neighbour(j);
			if(refneigh.Exists() && refneigh != thisside) {
				//como nao me deixam guardar o index do elemento geometrico...
				for (k=0;k<NSubEl+1;k++){
					if (this->GetRefPattern()->Element(k) == refneigh.Element() && k-1 != i){
						//    std::cout << "\t\t\tFound subel " << k << "  side of subel " << refneigh.Side()
						//      << "For subelement " << i << " side " << j << std::endl;
						TPZGeoElSide neighbour;
						if(k) {
							neighbour = TPZGeoElSide(SubElement(k-1),refneigh.Side());
						} else {
							neighbour = TPZGeoElSide(this, refneigh.Side());
						}
						TPZGeoElSide gs(SubElement(i),j);
						if(!gs.NeighbourExists(neighbour)) gs.SetConnectivity(neighbour);
						break;
					}
				}
				if(k == NSubEl+1) {
					//std::cout << "TPZGeoElRefPattern<TGeo>::Divide inconsistent datastructure subelement "
					//  << i << " Side " << j << std::endl;
				}
			} else {
				SubElement(i)->SetNeighbour(j,TPZGeoElSide(SubElement(i),j));
			}
		}
	}
	
	this->SetSubElementConnectivities();
#ifdef PZ_LOG
    {
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
        if (loggerrefpattern.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "Dividing element " << this->Index() << std::endl;
            sout << "Subelement indices ";
            for(i=0; i<NSubEl; i++) sout << SubElVec[i]->Index() << " ";
            LOGPZ_DEBUG(loggerrefpattern,sout.str())
        }
    }
#endif
}